

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::AdapterBase::AdapterBase(AdapterBase *this,Canceler *canceler)

{
  AdapterBase *pAVar1;
  AdapterBase *n;
  AdapterBase *_n248;
  Canceler *canceler_local;
  AdapterBase *this_local;
  
  this->_vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_00c0d5e0;
  Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::Maybe(&this->prev,&canceler->list);
  Maybe<kj::Canceler::AdapterBase_&>::Maybe(&this->next,&canceler->list);
  Maybe<kj::Canceler::AdapterBase_&>::operator=(&canceler->list,this);
  pAVar1 = kj::_::readMaybe<kj::Canceler::AdapterBase>(&this->next);
  if (pAVar1 != (AdapterBase *)0x0) {
    Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::operator=(&pAVar1->prev,&this->next);
  }
  return;
}

Assistant:

Canceler::AdapterBase::AdapterBase(Canceler& canceler)
    : prev(canceler.list),
      next(canceler.list) {
  canceler.list = *this;
  KJ_IF_SOME(n, next) {
    n.prev = next;
  }
}